

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O0

void compute_O_rc4_key(string *user_password,string *owner_password,EncryptionData *data,uchar *key)

{
  int iVar1;
  int iVar2;
  logic_error *this;
  char *data_00;
  int *piVar3;
  uchar *md;
  size_t extraout_RDX;
  size_t n;
  size_t n_00;
  Digest *digest_00;
  undefined1 auVar4 [16];
  int local_ac;
  unsigned_long local_a8;
  int local_a0;
  int local_9c;
  uchar auStack_98 [4];
  int key_len;
  Digest digest;
  undefined1 local_68 [8];
  MD5 md5;
  string password;
  uchar *key_local;
  EncryptionData *data_local;
  string *owner_password_local;
  string *user_password_local;
  
  md = key;
  iVar1 = QPDF::EncryptionData::getV(data);
  if (iVar1 < 5) {
    std::__cxx11::string::string
              ((string *)
               &md5.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(string *)owner_password);
    auVar4 = std::__cxx11::string::empty();
    n = auVar4._8_8_;
    if ((auVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      std::__cxx11::string::operator=
                ((string *)
                 &md5.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(string *)user_password);
      n = extraout_RDX;
      owner_password = user_password;
    }
    MD5::MD5((MD5 *)local_68,(uchar *)owner_password,n,md);
    pad_or_truncate_password_V4
              ((string *)(digest + 8),
               (string *)
               &md5.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    data_00 = (char *)std::__cxx11::string::c_str();
    MD5::encodeDataIncrementally((MD5 *)local_68,data_00,0x20);
    std::__cxx11::string::~string((string *)(digest + 8));
    local_a8 = 0x10;
    local_a0 = QIntC::to_int<unsigned_long>(&local_a8);
    local_ac = QPDF::EncryptionData::getLengthBytes(data);
    piVar3 = std::min<int>(&local_a0,&local_ac);
    local_9c = *piVar3;
    iVar2 = QPDF::EncryptionData::getR(data);
    iVar1 = 0;
    if (2 < iVar2) {
      iVar1 = 0x32;
    }
    digest_00 = (Digest *)auStack_98;
    iterate_md5_digest((MD5 *)local_68,digest_00,iVar1,local_9c);
    *(undefined8 *)key = _auStack_98;
    *(undefined8 *)(key + 8) = digest._0_8_;
    MD5::~MD5((MD5 *)local_68,*digest_00,n_00,(uchar *)digest._0_8_);
    std::__cxx11::string::~string
              ((string *)
               &md5.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    return;
  }
  this = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this,"compute_O_rc4_key called for file with V >= 5");
  __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

static void
compute_O_rc4_key(
    std::string const& user_password,
    std::string const& owner_password,
    QPDF::EncryptionData const& data,
    unsigned char key[OU_key_bytes_V4])
{
    if (data.getV() >= 5) {
        throw std::logic_error("compute_O_rc4_key called for file with V >= 5");
    }
    std::string password = owner_password;
    if (password.empty()) {
        password = user_password;
    }
    MD5 md5;
    md5.encodeDataIncrementally(pad_or_truncate_password_V4(password).c_str(), key_bytes);
    MD5::Digest digest;
    int key_len = std::min(QIntC::to_int(sizeof(digest)), data.getLengthBytes());
    iterate_md5_digest(md5, digest, ((data.getR() >= 3) ? 50 : 0), key_len);
    memcpy(key, digest, OU_key_bytes_V4);
}